

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O1

string * replaceHtmlSymbols(string *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  for (uVar4 = std::__cxx11::string::find((char *)str,0x1ea5b8,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)str,0x1ea5b8,uVar4 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar4,(char *)0x5,0x1eddbf);
  }
  for (uVar4 = std::__cxx11::string::find((char *)str,0x1ea5be,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)str,0x1ea5be,uVar4 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar4,(char *)0x6,0x1ea4e4);
  }
  for (uVar4 = std::__cxx11::string::find((char *)str,0x1eddc1,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)str,0x1eddc1,uVar4 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar4,(char *)0x6,0x1eb139);
  }
  for (uVar4 = std::__cxx11::string::find((char *)str,0x1f70da,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)str,0x1f70da,uVar4 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar4,(char *)0x4,0x1ea5d2);
  }
  for (uVar4 = std::__cxx11::string::find((char *)str,0x1ea5b3,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)str,0x1ea5b3,uVar4 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar4,(char *)0x4,0x1ead3d);
  }
  for (uVar4 = std::__cxx11::string::find((char *)str,0x1eddc8,0); uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find((char *)str,0x1eddc8,uVar4 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar4,(char *)0x8,0x1ea4e4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline std::string replaceHtmlSymbols(std::string str) {
    str::replace_all(str, "&amp;", "&");
    str::replace_all(str, "&quot;", "\"");
    str::replace_all(str, "&apos;", "'");
    str::replace_all(str, "&gt;", ">");
    str::replace_all(str, "&lt;", "<");
    str::replace_all(str, "&#x200B;", "\"");
    return str;
}